

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool __thiscall
cmDependsFortran::Finalize(cmDependsFortran *this,ostream *makeDepends,ostream *internalDepends)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  cmDependsFortranInternals *pcVar2;
  string *psVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  string *psVar6;
  _Rb_tree_node_base *p_Var7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string mod_dir;
  string currentBinDir;
  string fcName;
  string fiName;
  string stamp;
  string mod_lower;
  string mod_upper;
  cmGeneratedFileStream fcStream;
  cmGeneratedFileStream fiStream;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  cmGeneratedFileStream local_4c0;
  cmGeneratedFileStream local_278;
  
  LocateModules(this);
  this_00 = ((this->super_cmDepends).LocalGenerator)->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"CMAKE_Fortran_TARGET_MODULE_DIR",(allocator<char> *)&local_4c0);
  psVar3 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_278);
  std::__cxx11::string::string((string *)&local_5c0,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_278);
  if (local_5c0._M_string_length == 0) {
    cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmDepends).LocalGenerator);
    std::__cxx11::string::_M_assign((string *)&local_5c0);
  }
  psVar3 = &(this->super_cmDepends).TargetDirectory;
  pcVar2 = this->Internal;
  for (p_Var4 = (pcVar2->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pcVar2->ObjectInfo)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    WriteDependenciesReal
              (this,(string *)(p_Var4 + 1),(cmFortranSourceInfo *)(p_Var4 + 2),&local_5c0,psVar3,
               makeDepends,internalDepends);
  }
  std::__cxx11::string::string((string *)&local_560,(string *)psVar3);
  std::__cxx11::string::append((char *)&local_560);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,&local_560,false,None);
  std::operator<<((ostream *)&local_278,"# The fortran modules provided by this target.\n");
  std::operator<<((ostream *)&local_278,"provides\n");
  pcVar2 = this->Internal;
  p_Var1 = &(pcVar2->TargetProvides)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var4 = (pcVar2->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar5 = std::operator<<((ostream *)&local_278," ");
    poVar5 = std::operator<<(poVar5,(string *)(p_Var4 + 1));
    std::operator<<(poVar5,"\n");
  }
  if ((pcVar2->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string((string *)&local_580,(string *)psVar3);
    std::__cxx11::string::append((char *)&local_580);
    cmGeneratedFileStream::cmGeneratedFileStream(&local_4c0,&local_580,false,None);
    std::operator<<((ostream *)&local_4c0,"# Remove fortran modules provided by this target.\n");
    std::operator<<((ostream *)&local_4c0,"FILE(REMOVE");
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       ((this->super_cmDepends).LocalGenerator);
    std::__cxx11::string::string((string *)&local_5a0,(string *)psVar6);
    for (p_Var7 = (pcVar2->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != p_Var1;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      std::__cxx11::string::string((string *)&local_4e0,(string *)&local_5c0);
      std::__cxx11::string::append((char *)&local_4e0);
      std::__cxx11::string::string((string *)&local_500,(string *)&local_5c0);
      std::__cxx11::string::append((char *)&local_500);
      cmFortranModuleAppendUpperLower((string *)(p_Var7 + 1),&local_4e0,&local_500);
      std::__cxx11::string::string((string *)&local_520,(string *)psVar3);
      std::__cxx11::string::append((char *)&local_520);
      std::__cxx11::string::append((string *)&local_520);
      std::__cxx11::string::append((char *)&local_520);
      std::operator<<((ostream *)&local_4c0,"\n");
      poVar5 = std::operator<<((ostream *)&local_4c0,"  \"");
      MaybeConvertToRelativePath(&local_540,this,&local_5a0,&local_500);
      poVar5 = std::operator<<(poVar5,(string *)&local_540);
      std::operator<<(poVar5,"\"\n");
      std::__cxx11::string::~string((string *)&local_540);
      poVar5 = std::operator<<((ostream *)&local_4c0,"  \"");
      MaybeConvertToRelativePath(&local_540,this,&local_5a0,&local_4e0);
      poVar5 = std::operator<<(poVar5,(string *)&local_540);
      std::operator<<(poVar5,"\"\n");
      std::__cxx11::string::~string((string *)&local_540);
      poVar5 = std::operator<<((ostream *)&local_4c0,"  \"");
      MaybeConvertToRelativePath(&local_540,this,&local_5a0,&local_520);
      poVar5 = std::operator<<(poVar5,(string *)&local_540);
      std::operator<<(poVar5,"\"\n");
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_4e0);
    }
    std::operator<<((ostream *)&local_4c0,"  )\n");
    std::__cxx11::string::~string((string *)&local_5a0);
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_4c0);
    std::__cxx11::string::~string((string *)&local_580);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_5c0);
  return true;
}

Assistant:

bool cmDependsFortran::Finalize(std::ostream& makeDepends,
                                std::ostream& internalDepends)
{
  // Prepare the module search process.
  this->LocateModules();

  // Get the directory in which stamp files will be stored.
  const std::string& stamp_dir = this->TargetDirectory;

  // Get the directory in which module files will be created.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  std::string mod_dir =
    mf->GetSafeDefinition("CMAKE_Fortran_TARGET_MODULE_DIR");
  if (mod_dir.empty()) {
    mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  }

  // Actually write dependencies to the streams.
  typedef cmDependsFortranInternals::ObjectInfoMap ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (auto const& i : objInfo) {
    if (!this->WriteDependenciesReal(i.first, i.second, mod_dir, stamp_dir,
                                     makeDepends, internalDepends)) {
      return false;
    }
  }

  // Store the list of modules provided by this target.
  std::string fiName = this->TargetDirectory;
  fiName += "/fortran.internal";
  cmGeneratedFileStream fiStream(fiName);
  fiStream << "# The fortran modules provided by this target.\n";
  fiStream << "provides\n";
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::string const& i : provides) {
    fiStream << " " << i << "\n";
  }

  // Create a script to clean the modules.
  if (!provides.empty()) {
    std::string fcName = this->TargetDirectory;
    fcName += "/cmake_clean_Fortran.cmake";
    cmGeneratedFileStream fcStream(fcName);
    fcStream << "# Remove fortran modules provided by this target.\n";
    fcStream << "FILE(REMOVE";
    std::string currentBinDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::string const& i : provides) {
      std::string mod_upper = mod_dir;
      mod_upper += "/";
      std::string mod_lower = mod_dir;
      mod_lower += "/";
      cmFortranModuleAppendUpperLower(i, mod_upper, mod_lower);
      std::string stamp = stamp_dir;
      stamp += "/";
      stamp += i;
      stamp += ".stamp";
      fcStream << "\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, mod_lower)
               << "\"\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, mod_upper)
               << "\"\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, stamp)
               << "\"\n";
    }
    fcStream << "  )\n";
  }
  return true;
}